

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_2badaf::check<double>(istream *is,double c)

{
  ostream *poVar1;
  uchar b [8];
  
  std::istream::read((char *)is,(long)b);
  poVar1 = std::operator<<((ostream *)&std::cout,_hufCompress + (*_hufCompress == '*'));
  std::operator<<(poVar1,": expected ");
  poVar1 = std::ostream::_M_insert<double>(c);
  std::operator<<(poVar1,", got ");
  poVar1 = std::ostream::_M_insert<double>((double)b);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (((double)b == c) && (!NAN((double)b) && !NAN(c))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = double]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}